

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxin.cpp
# Opt level: O0

ScriptWitness * GetExpectWitnessStack(void)

{
  ScriptWitness *in_RDI;
  allocator local_a1;
  string local_a0;
  ByteData local_80;
  allocator local_51;
  string local_50;
  ByteData local_30;
  undefined1 local_11;
  ScriptWitness *exp_witness_stack;
  
  local_11 = 0;
  cfd::core::ScriptWitness::ScriptWitness(in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_50,
             "3044022075282f574650e20c3a87d0d1f67d0bcd8f9319b26d244eb254c0aa5bc0284e8002205bddfd4e2f5e278de5f473804a1d061ed6f9bdbcb65fec9b20402879c5a9980901"
             ,&local_51);
  cfd::core::ByteData::ByteData(&local_30,&local_50);
  cfd::core::ScriptWitness::AddWitnessStack(in_RDI,&local_30);
  cfd::core::ByteData::~ByteData(&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a0,
             "025c36c65910268ee06421053cb9bab1c849c4bdd467d6e77a89d33ff213adc3ca",&local_a1);
  cfd::core::ByteData::ByteData(&local_80,&local_a0);
  cfd::core::ScriptWitness::AddWitnessStack(in_RDI,&local_80);
  cfd::core::ByteData::~ByteData(&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  return in_RDI;
}

Assistant:

static ScriptWitness GetExpectWitnessStack() {
  ScriptWitness exp_witness_stack;
  exp_witness_stack.AddWitnessStack(ByteData("3044022075282f574650e20c3a87d0d1f67d0bcd8f9319b26d244eb254c0aa5bc0284e8002205bddfd4e2f5e278de5f473804a1d061ed6f9bdbcb65fec9b20402879c5a9980901"));
  exp_witness_stack.AddWitnessStack(ByteData("025c36c65910268ee06421053cb9bab1c849c4bdd467d6e77a89d33ff213adc3ca"));
  return exp_witness_stack;
}